

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall
chrono::robosimian::RS_Limb::RS_Limb
          (RS_Limb *this,string *name,LimbID id,LinkData *data,
          shared_ptr<chrono::ChMaterialSurface> *wheel_mat,
          shared_ptr<chrono::ChMaterialSurface> *link_mat,ChSystem *system)

{
  double dVar1;
  pointer pcVar2;
  ChFrame *pCVar3;
  pointer pCVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long *plVar6;
  undefined8 *puVar7;
  double *pdVar8;
  LinkData *__x;
  double *pdVar9;
  pointer pCVar10;
  shared_ptr<chrono::robosimian::RS_Part> link;
  ChVector<double> inertia_xx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  CylinderShape cyl;
  ChVector<double> inertia_xy;
  shared_ptr<chrono::robosimian::RS_Part> local_198;
  RS_Limb *local_180;
  RS_Part *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  double local_168;
  long *local_160;
  undefined8 local_158;
  long alStack_150 [2];
  int local_13c;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_138;
  long local_130;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  undefined1 local_118 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_90;
  shared_ptr<chrono::ChMaterialSurface> *local_88;
  shared_ptr<chrono::ChMaterialSurface> *local_80;
  undefined **local_78;
  ulong local_70;
  LinkData *local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_88 = wheel_mat;
  local_80 = link_mat;
  local_68 = data;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + name->_M_string_length);
  local_138 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&this->m_links;
  (this->m_links)._M_h._M_buckets = &(this->m_links)._M_h._M_single_bucket;
  (this->m_links)._M_h._M_bucket_count = 1;
  (this->m_links)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_links)._M_h._M_element_count = 0;
  (this->m_links)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_links)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_links)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_joints)._M_h._M_buckets = &(this->m_joints)._M_h._M_single_bucket;
  (this->m_joints)._M_h._M_bucket_count = 1;
  (this->m_joints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_joints)._M_h._M_element_count = 0;
  (this->m_joints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_joints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_joints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_motors)._M_h._M_buckets = &(this->m_motors)._M_h._M_single_bucket;
  (this->m_motors)._M_h._M_bucket_count = 1;
  (this->m_motors)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_motors)._M_h._M_element_count = 0;
  (this->m_motors)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [32])&(this->m_motors)._M_h._M_rehash_policy._M_next_resize = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])
   ((long)&(this->m_wheel).
           super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1) =
       ZEXT432(0) << 0x40;
  this->m_collide_wheel = true;
  local_70 = (ulong)(id * 4 + 4);
  local_90 = &(this->m_wheel).
              super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  local_78 = &PTR__ChFrame_0017db90;
  local_130 = 0;
  local_180 = this;
  do {
    pdVar9 = (double *)(local_118 + 0x10);
    __x = local_68 + local_130;
    local_13c = std::__cxx11::string::compare((char *)__x);
    local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_160 = alStack_150;
    if (local_13c == 0) {
      pcVar2 = (local_180->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar2,pcVar2 + (local_180->m_name)._M_string_length);
      std::__cxx11::string::append((char *)&local_160);
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_160,(ulong)(__x->name)._M_dataplus._M_p);
      pdVar8 = (double *)(puVar7 + 2);
      if ((double *)*puVar7 == pdVar8) {
        local_118._16_8_ = *pdVar8;
        local_118._24_8_ = puVar7[3];
        local_118._0_8_ = pdVar9;
      }
      else {
        local_118._16_8_ = *pdVar8;
        local_118._0_8_ = (double *)*puVar7;
      }
      local_118._8_8_ = puVar7[1];
      *puVar7 = pdVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_178 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::robosimian::RS_Part,std::allocator<chrono::robosimian::RS_Part>,std::__cxx11::string,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
                (&_Stack_170,&local_178,(allocator<chrono::robosimian::RS_Part> *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 local_88,&system);
    }
    else {
      pcVar2 = (local_180->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar2,pcVar2 + (local_180->m_name)._M_string_length);
      std::__cxx11::string::append((char *)&local_160);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_160,(ulong)(__x->name)._M_dataplus._M_p);
      pdVar8 = (double *)(plVar6 + 2);
      if ((double *)*plVar6 == pdVar8) {
        local_118._16_8_ = *pdVar8;
        local_118._24_8_ = plVar6[3];
        local_118._0_8_ = pdVar9;
      }
      else {
        local_118._16_8_ = *pdVar8;
        local_118._0_8_ = (double *)*plVar6;
      }
      local_118._8_8_ = plVar6[1];
      *plVar6 = (long)pdVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_178 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::robosimian::RS_Part,std::allocator<chrono::robosimian::RS_Part>,std::__cxx11::string,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
                (&_Stack_170,&local_178,(allocator<chrono::robosimian::RS_Part> *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 local_80,&system);
    }
    _Var5._M_pi = _Stack_170._M_pi;
    local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_178;
    this_00._M_pi =
         local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_178 = (RS_Part *)0x0;
    _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    if (_Stack_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_170._M_pi);
    }
    if ((double *)local_118._0_8_ != pdVar9) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if (local_160 != alStack_150) {
      operator_delete(local_160,alStack_150[0] + 1);
    }
    dVar1 = (__x->link).m_mass;
    local_50 = (__x->link).m_com.m_data[0];
    local_58 = (__x->link).m_com.m_data[1];
    local_60 = (__x->link).m_com.m_data[2];
    local_178 = (RS_Part *)(__x->link).m_inertia_xx.m_data[0];
    _Stack_170._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(__x->link).m_inertia_xx.m_data[1];
    local_168 = (__x->link).m_inertia_xx.m_data[2];
    local_48 = (__x->link).m_inertia_xy.m_data[0];
    local_40 = (__x->link).m_inertia_xy.m_data[1];
    local_38 = (__x->link).m_inertia_xy.m_data[2];
    *(int *)(((local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr + 0x28) = (int)local_70 + (int)local_130;
    chrono::ChVariablesBodyOwnMass::SetBodyMass(dVar1);
    pCVar3 = (ChFrame *)
             ((local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_160 = (long *)0x3ff0000000000000;
    alStack_150[1] = 0;
    local_158 = 0;
    alStack_150[0] = 0;
    local_118._0_8_ = local_78;
    local_118._8_8_ = local_50;
    local_118._16_8_ = local_58;
    local_118._24_8_ = local_60;
    local_118._32_8_ = 1.0;
    local_118._56_8_ = 0.0;
    local_118._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._48_8_ = 0.0;
    ChMatrix33<double>::ChMatrix33
              ((ChMatrix33<double> *)(local_118 + 0x40),(ChQuaternion<double> *)&local_160);
    chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar3);
    chrono::ChBody::SetInertiaXX
              (((local_198.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    chrono::ChBody::SetInertiaXY
              (((local_198.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    std::__cxx11::string::_M_assign
              ((string *)
               &(local_198.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->m_mesh_name);
    if (&(__x->link).m_offset !=
        &(local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_offset) {
      ((local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_offset).m_data[0] = (__x->link).m_offset.m_data[0];
      ((local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_offset).m_data[1] = (__x->link).m_offset.m_data[1];
      ((local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_offset).m_data[2] = (__x->link).m_offset.m_data[2];
    }
    if (&(__x->link).m_color !=
        &(local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_color) {
      ((local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_color).R = (__x->link).m_color.R;
      ((local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_color).G = (__x->link).m_color.G;
      ((local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_color).B = (__x->link).m_color.B;
    }
    pCVar4 = (__x->link).m_shapes.
             super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar10 = (__x->link).m_shapes.
                   super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar4;
        pCVar10 = pCVar10 + 1) {
      local_118._0_8_ = (pCVar10->m_pos).m_data[0];
      local_118._8_8_ = (pCVar10->m_pos).m_data[1];
      local_118._16_8_ = (pCVar10->m_pos).m_data[2];
      local_118._24_8_ = (pCVar10->m_rot).m_data[0];
      local_118._32_8_ = (pCVar10->m_rot).m_data[1];
      local_118._40_8_ = (pCVar10->m_rot).m_data[2];
      local_118._48_8_ = (pCVar10->m_rot).m_data[3];
      local_118._56_8_ = pCVar10->m_radius;
      local_118._64_8_ = pCVar10->m_length;
      std::
      vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
      ::push_back(&(local_198.
                    super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_cylinders,(value_type *)local_118);
    }
    if (__x->include != false) {
      local_128 = ((local_198.
                    super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_body).
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_120 = ((local_198.
                    super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_body).
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
      if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_120->_M_use_count = local_120->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_120->_M_use_count = local_120->_M_use_count + 1;
        }
      }
      chrono::ChSystem::Add(system,&local_128);
      if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
    ::pair<std::shared_ptr<chrono::robosimian::RS_Part>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
                *)local_118,&__x->name,&local_198);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::robosimian::RS_Part>>>
              (local_138,(value_type *)local_118);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if (local_13c == 0) {
      (local_180->m_wheel).
      super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_90,&local_198.
                           super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    }
    if (local_198.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_130 = local_130 + 1;
  } while (local_130 != 0xb);
  return;
}

Assistant:

RS_Limb::RS_Limb(const std::string& name,
                 LimbID id,
                 const LinkData data[],
                 std::shared_ptr<ChMaterialSurface> wheel_mat,
                 std::shared_ptr<ChMaterialSurface> link_mat,
                 ChSystem* system)
    : m_name(name), m_collide_links(false), m_collide_wheel(true) {
    for (int i = 0; i < num_links; i++) {
        bool is_wheel = (data[i].name.compare("link8") == 0);

        std::shared_ptr<RS_Part> link;
        if (is_wheel) {
            link = chrono_types::make_shared<RS_Part>(m_name + "_" + data[i].name, wheel_mat, system);
        } else {
            link = chrono_types::make_shared<RS_Part>(m_name + "_" + data[i].name, link_mat, system);
        }

        double mass = data[i].link.m_mass;
        ChVector<> com = data[i].link.m_com;
        ChVector<> inertia_xx = data[i].link.m_inertia_xx;
        ChVector<> inertia_xy = data[i].link.m_inertia_xy;

        link->m_body->SetIdentifier(4 + 4 * id + i);
        link->m_body->SetMass(mass);
        link->m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
        link->m_body->SetInertiaXX(inertia_xx);
        link->m_body->SetInertiaXY(inertia_xy);

        link->m_mesh_name = data[i].link.m_mesh_name;
        link->m_offset = data[i].link.m_offset;
        link->m_color = data[i].link.m_color;

        for (auto cyl : data[i].link.m_shapes) {
            link->m_cylinders.push_back(cyl);
        }

        if (data[i].include)
            system->Add(link->m_body);

        m_links.insert(std::make_pair(data[i].name, link));
        if (is_wheel)
            m_wheel = link;
    }
}